

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void readPoints<Point3f,std::vector<Point3f,std::allocator<Point3f>>>
               (string *filename,vector<Point3f,_std::allocator<Point3f>_> *points)

{
  pointer *ppPVar1;
  long lVar2;
  iterator __position;
  char cVar3;
  bool bVar4;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  char_separator<char,_std::char_traits<char>_> sep;
  tokenizer<boost::char_separator<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tokenizer;
  ifstream in;
  undefined1 auStack_458 [4];
  float local_454;
  undefined1 local_450 [8];
  type_info_t *local_448;
  type_info_t *local_440;
  float local_438;
  float local_434;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  long local_410;
  long local_408;
  char_separator<char,_std::char_traits<char>_> local_3f8;
  tokenizer<boost::char_separator<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  iter local_348;
  iter local_2c0;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(filename->_M_dataplus)._M_p,_S_in);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430._M_string_length = 0;
  local_430.field_2._M_local_buf[0] = '\0';
  boost::char_separator<char,_std::char_traits<char>_>::char_separator
            (&local_3f8," ",(char *)0x0,drop_empty_tokens);
  lVar2 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar2] & 2) == 0) {
    do {
      cVar3 = std::ios::widen((char)auStack_458 + (char)lVar2 + ' ');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_430,cVar3);
      std::istream::peek();
      boost::
      tokenizer<boost::char_separator<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string>
      ::tokenizer<std::__cxx11::string>
                ((tokenizer<boost::char_separator<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string>
                  *)&local_3a8,&local_430,&local_3f8);
      boost::
      tokenizer<boost::char_separator<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::begin(&local_2c0,&local_3a8);
      boost::
      tokenizer<boost::char_separator<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::end(&local_348,&local_3a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<boost::token_iterator<boost::char_separator<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_410,
                 &local_2c0,&local_348,(allocator_type *)local_450);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348.tok_._M_dataplus._M_p != &local_348.tok_.field_2) {
        operator_delete(local_348.tok_._M_dataplus._M_p,
                        local_348.tok_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348.f_.m_dropped_delims._M_dataplus._M_p !=
          &local_348.f_.m_dropped_delims.field_2) {
        operator_delete(local_348.f_.m_dropped_delims._M_dataplus._M_p,
                        local_348.f_.m_dropped_delims.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348.f_.m_kept_delims._M_dataplus._M_p != &local_348.f_.m_kept_delims.field_2) {
        operator_delete(local_348.f_.m_kept_delims._M_dataplus._M_p,
                        local_348.f_.m_kept_delims.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0.tok_._M_dataplus._M_p != &local_2c0.tok_.field_2) {
        operator_delete(local_2c0.tok_._M_dataplus._M_p,
                        local_2c0.tok_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0.f_.m_dropped_delims._M_dataplus._M_p !=
          &local_2c0.f_.m_dropped_delims.field_2) {
        operator_delete(local_2c0.f_.m_dropped_delims._M_dataplus._M_p,
                        local_2c0.f_.m_dropped_delims.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0.f_.m_kept_delims._M_dataplus._M_p != &local_2c0.f_.m_kept_delims.field_2) {
        operator_delete(local_2c0.f_.m_kept_delims._M_dataplus._M_p,
                        local_2c0.f_.m_kept_delims.field_2._M_allocated_capacity + 1);
      }
      if (local_408 - local_410 == 0xc0) {
        local_454 = 0.0;
        local_450 = *(undefined1 (*) [8])(local_410 + 0x60);
        local_448 = (type_info_t *)((long)local_450 + *(long *)(local_410 + 0x68));
        bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                float_types_converter_internal<float>
                          ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)local_450,
                           &local_454);
        if (!bVar4) {
          local_450 = (undefined1  [8])&PTR__bad_cast_0010cd60;
          local_448 = (type_info_t *)&std::__cxx11::string::typeinfo;
          local_440 = (type_info_t *)&float::typeinfo;
          boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_450);
        }
        local_434 = local_454;
        local_454 = 0.0;
        local_450 = *(undefined1 (*) [8])(local_410 + 0x80);
        local_448 = (type_info_t *)((long)local_450 + *(long *)(local_410 + 0x88));
        bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                float_types_converter_internal<float>
                          ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)local_450,
                           &local_454);
        if (!bVar4) {
          local_450 = (undefined1  [8])&PTR__bad_cast_0010cd60;
          local_448 = (type_info_t *)&std::__cxx11::string::typeinfo;
          local_440 = (type_info_t *)&float::typeinfo;
          boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_450);
        }
        local_438 = local_454;
        local_454 = 0.0;
        local_450 = *(undefined1 (*) [8])(local_410 + 0xa0);
        local_448 = (type_info_t *)((long)local_450 + *(long *)(local_410 + 0xa8));
        bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                float_types_converter_internal<float>
                          ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)local_450,
                           &local_454);
        if (!bVar4) {
          local_450 = (undefined1  [8])&PTR__bad_cast_0010cd60;
          local_448 = (type_info_t *)&std::__cxx11::string::typeinfo;
          local_440 = (type_info_t *)&float::typeinfo;
          boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_450);
        }
        local_450._4_4_ = local_438;
        local_450._0_4_ = local_434;
        local_448 = (type_info_t *)CONCAT44(local_448._4_4_,local_454);
        __position._M_current =
             (points->super__Vector_base<Point3f,_std::allocator<Point3f>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (points->super__Vector_base<Point3f,_std::allocator<Point3f>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Point3f,_std::allocator<Point3f>_>::_M_realloc_insert<Point3f>
                    (points,__position,(Point3f *)local_450);
        }
        else {
          (__position._M_current)->z = local_454;
          (__position._M_current)->x = local_434;
          (__position._M_current)->y = local_438;
          ppPVar1 = &(points->super__Vector_base<Point3f,_std::allocator<Point3f>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppPVar1 = *ppPVar1 + 1;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_410);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.f_.m_dropped_delims._M_dataplus._M_p !=
          &local_3a8.f_.m_dropped_delims.field_2) {
        operator_delete(local_3a8.f_.m_dropped_delims._M_dataplus._M_p,
                        local_3a8.f_.m_dropped_delims.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.f_.m_kept_delims._M_dataplus._M_p != &local_3a8.f_.m_kept_delims.field_2) {
        operator_delete(local_3a8.f_.m_kept_delims._M_dataplus._M_p,
                        local_3a8.f_.m_kept_delims.field_2._M_allocated_capacity + 1);
      }
      lVar2 = *(long *)(local_238[0] + -0x18);
    } while ((abStack_218[lVar2] & 2) == 0);
  }
  std::ifstream::close();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_dropped_delims._M_dataplus._M_p != &local_3f8.m_dropped_delims.field_2) {
    operator_delete(local_3f8.m_dropped_delims._M_dataplus._M_p,
                    local_3f8.m_dropped_delims.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_kept_delims._M_dataplus._M_p != &local_3f8.m_kept_delims.field_2) {
    operator_delete(local_3f8.m_kept_delims._M_dataplus._M_p,
                    local_3f8.m_kept_delims.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,
                    CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                             local_430.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void readPoints(const std::string& filename, ContainerT& points)
{
  std::ifstream in(filename.c_str());
  std::string line;
  boost::char_separator<char> sep(" ");
  // read point cloud from "freiburg format"
  while (!in.eof())
  {
    std::getline(in, line);
    in.peek();

    boost::tokenizer<boost::char_separator<char> > tokenizer(line, sep);
    std::vector<std::string> tokens(tokenizer.begin(), tokenizer.end());

    if (tokens.size() != 6) continue;
    float x = boost::lexical_cast<float>(tokens[3]);
    float y = boost::lexical_cast<float>(tokens[4]);
    float z = boost::lexical_cast<float>(tokens[5]);

    points.push_back(PointT(x, y, z));
  }

  in.close();
}